

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
::resize_buffer(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
                *this,size_type size)

{
  iffl *this_00;
  pointer_type __src;
  pointer_type pcVar1;
  default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *in_R8;
  long lVar2;
  char *pcVar3;
  char *new_buffer;
  size_t new_buffer_size;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  deallocate_buffer;
  sizes_t prev_sizes;
  char *local_b0;
  char local_a1;
  size_t local_a0;
  pointer_type local_98;
  pointer_type pcStack_90;
  pointer_type local_88;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_vladp72[P]iffl_include_iffl_list_h:5640:33)>
  local_78;
  pair<bool,_iffl::flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>_>
  local_58;
  sizes_t local_38;
  
  buffer_t<char>::validate((buffer_t<char> *)this);
  get_all_sizes(&local_38,this);
  local_78.super_anon_class_24_3_566c83a5.buffer = &local_b0;
  local_b0 = (char *)0x0;
  local_78.super_anon_class_24_3_566c83a5.buffer_size = &local_a0;
  local_a0 = 0;
  local_78.armed_ = true;
  local_78.super_anon_class_24_3_566c83a5.this =
       (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
        *)this;
  if (local_38.total_capacity < size) {
    local_b0 = allocate_buffer(this,size);
    local_a0 = size;
    if ((this->buffer_).v2_.last != (pointer_type)0x0) {
      memcpy(local_b0,(this->buffer_).v2_.begin,local_38.last_element.super_range.data_end);
      (this->buffer_).v2_.last = local_b0 + local_38.last_element.super_range.buffer_begin;
    }
  }
  else {
    if (size == 0) {
      clear(this);
      goto LAB_001086c9;
    }
    if (local_38.total_capacity <= size) goto LAB_001086c9;
    local_b0 = allocate_buffer(this,size);
    if (size < local_38.last_element.super_range.data_end) {
      this_00 = (iffl *)(this->buffer_).v2_.begin;
      local_a0 = size;
      flat_forward_list_validate_has_next_offset<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,iffl::default_validate_element_fn<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>>
                (&local_58,this_00,(char *)(this_00 + size),&local_a1,in_R8);
      local_98 = local_58.second.buffer_.begin;
      pcStack_90 = local_58.second.buffer_.last;
      local_88 = local_58.second.buffer_.end;
      if (local_58.first == true) {
        flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
        ::last((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                *)&local_58);
        if ((pointer_type)CONCAT71(local_58._1_7_,local_58.first) != (this->buffer_).v2_.last) {
LAB_00108642:
          std::terminate();
        }
      }
      else {
        flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
        ::last((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                *)&local_58);
        if ((pointer_type)CONCAT71(local_58._1_7_,local_58.first) == (this->buffer_).v2_.last)
        goto LAB_00108642;
      }
      flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
      ::last((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&local_58);
      pcVar1 = (pointer_type)CONCAT71(local_58._1_7_,local_58.first);
    }
    else {
      pcVar1 = (this->buffer_).v2_.last;
      local_a0 = size;
    }
    if (pcVar1 == (pointer_type)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      __src = (this->buffer_).v2_.begin;
      lVar2 = (long)pcVar1 - (long)__src;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      memcpy(local_b0,__src,*(long *)(pcVar1 + 0x10) + lVar2 + 0x18);
      pcVar3 = local_b0 + lVar2;
    }
    (this->buffer_).v2_.last = pcVar3;
  }
  commit_new_buffer(this,&local_b0,&local_a0);
  (this->buffer_).v2_.end = (this->buffer_).v2_.begin + size;
LAB_001086c9:
  buffer_t<char>::validate((buffer_t<char> *)this);
  validate_data_invariants(this);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/vladp72[P]iffl/include/iffl_list.h:5640:33)>
  ::discharge(&local_78);
  return;
}

Assistant:

void resize_buffer(size_type size) {
        validate_pointer_invariants();

        sizes_t const prev_sizes{ get_all_sizes() };

        char *new_buffer{ nullptr };
        size_t new_buffer_size{ 0 };
        auto deallocate_buffer{ make_scoped_deallocator(&new_buffer, &new_buffer_size) };
        //
        // growing capacity
        //
        if (prev_sizes.total_capacity < size) {
            new_buffer = allocate_buffer(size);
            new_buffer_size = size;
            if (nullptr != buff().last) {
                copy_data(new_buffer, buff().begin, prev_sizes.used_capacity().size);
                buff().last = new_buffer + prev_sizes.last_element.begin();
            }
            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        //
        // shrinking to 0 is simple
        //
        } else if (0 == size) {
            clear();
        //
        // to shrink to a smaller size we first need to 
        // find last element that would completely fit 
        // in the new buffer, and if we found any, then
        // make it new last element. If we did not find 
        // any, then designate that there are no last 
        // element
        //
        } else if (prev_sizes.total_capacity > size) {

            new_buffer = allocate_buffer(size);
            new_buffer_size = size;

            bool is_valid{ true };
            char *last_valid{ buff().last };
            //
            // If we are shrinking below used capacity then last element will
            // be removed, and we need to do linear search for the new last element 
            // that would fit new buffer size.
            //
            if (prev_sizes.used_capacity().size > size) {
                flat_forward_list_ref<T, TT> buffer_view;
                std::tie(is_valid, buffer_view) = flat_forward_list_validate<T, TT>(buff().begin,
                                                                                    buff().begin + size);
                if (is_valid) {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() == buff().last);
                } else {
                    FFL_CODDING_ERROR_IF_NOT(buffer_view.last().get_ptr() != buff().last);
                }
                last_valid = buffer_view.last().get_ptr();
            }

            if (last_valid) {
                size_type new_last_element_offset = last_valid - buff().begin;

                size_with_padding_t const last_valid_element_size{ traits_traits::get_size(last_valid) };
                size_type const new_used_capacity{ new_last_element_offset + last_valid_element_size.size };
                
                set_no_next_element(last_valid);
                
                copy_data(new_buffer, buff().begin, new_used_capacity);
                buff().last = new_buffer + new_last_element_offset;
            } else {
                buff().last = nullptr;
            }

            commit_new_buffer(new_buffer, new_buffer_size);
            buff().end = buff().begin + size;
        }

        validate_pointer_invariants();
        validate_data_invariants();
    }